

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3AnalysisLoad(sqlite3 *db,int iDb)

{
  uint *puVar1;
  ushort *puVar2;
  Schema *pSVar3;
  int iVar4;
  Table *pTVar5;
  char *pcVar6;
  HashElem *pHVar7;
  HashElem *pHVar8;
  long in_FS_OFFSET;
  sqlite3 *local_38;
  char *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pSVar3 = db->aDb[iDb].pSchema;
  pHVar7 = (HashElem *)&(pSVar3->tblHash).first;
  while (pHVar7 = pHVar7->next, pHVar7 != (HashElem *)0x0) {
    puVar1 = (uint *)((long)pHVar7->data + 0x30);
    *puVar1 = *puVar1 & 0xffffffef;
  }
  pHVar8 = (HashElem *)&(pSVar3->idxHash).first;
  pHVar7 = pHVar8;
  while (pHVar7 = pHVar7->next, pHVar7 != (HashElem *)0x0) {
    puVar2 = (ushort *)((long)pHVar7->data + 99);
    *puVar2 = *puVar2 & 0xff7f;
  }
  pcVar6 = db->aDb[iDb].zDbSName;
  local_38 = db;
  local_30 = pcVar6;
  pTVar5 = sqlite3FindTable(db,"sqlite_stat1",pcVar6);
  iVar4 = 0;
  if ((pTVar5 != (Table *)0x0) && (pTVar5->eTabType == '\0')) {
    pcVar6 = sqlite3MPrintf(db,"SELECT tbl,idx,stat FROM %Q.sqlite_stat1",pcVar6);
    if (pcVar6 == (char *)0x0) {
      iVar4 = 7;
    }
    else {
      iVar4 = sqlite3_exec(db,pcVar6,analysisLoader,&local_38,(char **)0x0);
      sqlite3DbFreeNN(db,pcVar6);
    }
  }
  while (pHVar8 = pHVar8->next, pHVar8 != (HashElem *)0x0) {
    if ((((Index *)pHVar8->data)->field_0x63 & 0x80) == 0) {
      sqlite3DefaultRowEst((Index *)pHVar8->data);
    }
  }
  if (iVar4 == 7) {
    sqlite3OomFault(db);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return iVar4;
  }
  __stack_chk_fail();
}

Assistant:

SQLITE_PRIVATE int sqlite3AnalysisLoad(sqlite3 *db, int iDb){
  analysisInfo sInfo;
  HashElem *i;
  char *zSql;
  int rc = SQLITE_OK;
  Schema *pSchema = db->aDb[iDb].pSchema;
  const Table *pStat1;

  assert( iDb>=0 && iDb<db->nDb );
  assert( db->aDb[iDb].pBt!=0 );

  /* Clear any prior statistics */
  assert( sqlite3SchemaMutexHeld(db, iDb, 0) );
  for(i=sqliteHashFirst(&pSchema->tblHash); i; i=sqliteHashNext(i)){
    Table *pTab = sqliteHashData(i);
    pTab->tabFlags &= ~TF_HasStat1;
  }
  for(i=sqliteHashFirst(&pSchema->idxHash); i; i=sqliteHashNext(i)){
    Index *pIdx = sqliteHashData(i);
    pIdx->hasStat1 = 0;
#ifdef SQLITE_ENABLE_STAT4
    sqlite3DeleteIndexSamples(db, pIdx);
    pIdx->aSample = 0;
#endif
  }

  /* Load new statistics out of the sqlite_stat1 table */
  sInfo.db = db;
  sInfo.zDatabase = db->aDb[iDb].zDbSName;
  if( (pStat1 = sqlite3FindTable(db, "sqlite_stat1", sInfo.zDatabase))
   && IsOrdinaryTable(pStat1)
  ){
    zSql = sqlite3MPrintf(db,
        "SELECT tbl,idx,stat FROM %Q.sqlite_stat1", sInfo.zDatabase);
    if( zSql==0 ){
      rc = SQLITE_NOMEM_BKPT;
    }else{
      rc = sqlite3_exec(db, zSql, analysisLoader, &sInfo, 0);
      sqlite3DbFree(db, zSql);
    }
  }

  /* Set appropriate defaults on all indexes not in the sqlite_stat1 table */
  assert( sqlite3SchemaMutexHeld(db, iDb, 0) );
  for(i=sqliteHashFirst(&pSchema->idxHash); i; i=sqliteHashNext(i)){
    Index *pIdx = sqliteHashData(i);
    if( !pIdx->hasStat1 ) sqlite3DefaultRowEst(pIdx);
  }

  /* Load the statistics from the sqlite_stat4 table. */
#ifdef SQLITE_ENABLE_STAT4
  if( rc==SQLITE_OK ){
    DisableLookaside;
    rc = loadStat4(db, sInfo.zDatabase);
    EnableLookaside;
  }
  for(i=sqliteHashFirst(&pSchema->idxHash); i; i=sqliteHashNext(i)){
    Index *pIdx = sqliteHashData(i);
    sqlite3_free(pIdx->aiRowEst);
    pIdx->aiRowEst = 0;
  }
#endif

  if( rc==SQLITE_NOMEM ){
    sqlite3OomFault(db);
  }
  return rc;
}